

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingMate::ChLoadXYZROTnodeBodyBushingMate
          (ChLoadXYZROTnodeBodyBushingMate *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping,ChVector<double> *mrotstiffness,
          ChVector<double> *mrotdamping)

{
  shared_ptr<chrono::ChBody> local_38;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_28;
  
  local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChLoadXYZROTnodeBodyBushingSpherical::ChLoadXYZROTnodeBodyBushingSpherical
            (&this->super_ChLoadXYZROTnodeBodyBushingSpherical,&local_28,&local_38,abs_application,
             mstiffness,mdamping);
  if (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_ChLoadXYZROTnodeBodyBushingSpherical).super_ChLoadXYZROTnodeBody.
  super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeBody_00b53468;
  (this->rot_stiffness).m_data[0] = mrotstiffness->m_data[0];
  (this->rot_stiffness).m_data[1] = mrotstiffness->m_data[1];
  (this->rot_stiffness).m_data[2] = mrotstiffness->m_data[2];
  (this->rot_damping).m_data[0] = mrotdamping->m_data[0];
  (this->rot_damping).m_data[1] = mrotdamping->m_data[1];
  (this->rot_damping).m_data[2] = mrotdamping->m_data[2];
  return;
}

Assistant:

ChLoadXYZROTnodeBodyBushingMate::ChLoadXYZROTnodeBodyBushingMate(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                                                 std::shared_ptr<ChBody> mbodyB,
                                                                 const ChFrame<>& abs_application,
                                                                 const ChVector<>& mstiffness,
                                                                 const ChVector<>& mdamping,
                                                                 const ChVector<>& mrotstiffness,
                                                                 const ChVector<>& mrotdamping)
    : ChLoadXYZROTnodeBodyBushingSpherical(mnodeA, mbodyB, abs_application, mstiffness, mdamping),
      rot_stiffness(mrotstiffness),
      rot_damping(mrotdamping) {}